

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_seed_insecure_rand::test_method(util_seed_insecure_rand *this)

{
  bool bVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  uint32_t rval;
  int i;
  int count;
  int err;
  int mask;
  int mod;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  assertion_result *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  BasicTestingSetup *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  lazy_ostream *in_stack_fffffffffffffe98;
  assertion_result *file;
  unit_test_log_t *this_00;
  int local_114;
  int local_110;
  uint local_108;
  uint local_104;
  const_string local_f8 [2];
  lazy_ostream local_d8 [2];
  assertion_result local_b8 [2];
  lazy_ostream local_60 [2];
  assertion_result local_40;
  unit_test_log_t local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest
            (in_stack_fffffffffffffe88,(SeedRand)((ulong)in_stack_fffffffffffffe80 >> 0x20));
  for (local_104 = 2; (int)local_104 < 0xb; local_104 = local_104 + 1) {
    local_108 = 1;
    sqrt(((1.0 / (double)(int)local_104) * (1.0 - 1.0 / (double)(int)local_104)) / 10000.0);
    for (; (int)local_108 < (int)(local_104 - 1); local_108 = local_108 * 2 + 1) {
    }
    local_110 = 0;
    for (local_114 = 0; local_114 < 10000; local_114 = local_114 + 1) {
      do {
        uVar2 = RandomMixin<FastRandomContext>::rand32
                          ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe68);
      } while (local_104 <= (uVar2 & local_108));
      local_110 = (uint)((uVar2 & local_108) == 0) + local_110;
    }
    do {
      this_00 = local_18;
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,(const_string *)file,(size_t)in_stack_fffffffffffffe98,
                 (const_string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe68 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_40,local_60,(const_string *)&stack0xffffffffffffff80,0x1e1,CHECK,CHECK_PRED)
      ;
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffe68);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe68);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      in_stack_fffffffffffffe78 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)boost::unit_test::(anonymous_namespace)::unit_test_log
                 ,(pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,(const_string *)file,(size_t)in_stack_fffffffffffffe98,
                 (const_string *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      in_stack_fffffffffffffe94 = local_110;
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77);
      in_stack_fffffffffffffe98 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe68);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe78,
                 (pointer)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
                 (unsigned_long)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe68 =
           (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
            *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_b8,local_d8,local_f8,0x1e2,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(in_stack_fffffffffffffe68);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe68);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_seed_insecure_rand)
{
    SeedRandomForTest(SeedRand::ZEROS);
    for (int mod=2;mod<11;mod++)
    {
        int mask = 1;
        // Really rough binomial confidence approximation.
        int err = 30*10000./mod*sqrt((1./mod*(1-1./mod))/10000.);
        //mask is 2^ceil(log2(mod))-1
        while(mask<mod-1)mask=(mask<<1)+1;

        int count = 0;
        //How often does it get a zero from the uniform range [0,mod)?
        for (int i = 0; i < 10000; i++) {
            uint32_t rval;
            do{
                rval=m_rng.rand32()&mask;
            }while(rval>=(uint32_t)mod);
            count += rval==0;
        }
        BOOST_CHECK(count<=10000/mod+err);
        BOOST_CHECK(count>=10000/mod-err);
    }
}